

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-cast-registerer.cpp
# Opt level: O2

void __thiscall custom_matrix_registerer::test_method(custom_matrix_registerer *this)

{
  size_t sVar1;
  undefined **local_310;
  undefined1 local_308;
  undefined8 *local_300;
  char **local_2f8;
  allocator<char> local_2f0 [16];
  shared_count local_2e0;
  output_test_stream output;
  string local_158;
  Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> myMatrixSignal;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"matrix",(allocator<char> *)&output);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::Signal
            (&myMatrixSignal,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  local_30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_28 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_30,1);
  (*myMatrixSignal.super_SignalBase<int>._vptr_SignalBase[0x15])(&myMatrixSignal,&output);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xad);
  local_60 = "Sig:matrix (Type Cst)";
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("Sig:matrix (Type Cst)");
  local_58 = "Sig:matrix (Type Cst)" + sVar1;
  boost::test_tools::output_test_stream::is_equal(local_2f0,&output,&local_60,1);
  local_2f8 = &local_70;
  local_70 = "output.is_equal(\"Sig:matrix (Type Cst)\")";
  local_68 = "";
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_0012fab8;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
  ;
  local_78 = "";
  boost::test_tools::tt_detail::report_assertion(local_2f0,&local_310,&local_80,0xad,1,0,0);
  boost::detail::shared_count::~shared_count(&local_2e0);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"test",local_2f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"[test",local_2f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"[5[",local_2f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"[5,c",local_2f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"[5,3[",local_2f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"[5,3]test",local_2f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"[5,3](test",local_2f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"[5,3]((1,",local_2f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"[5,3]((1,2,3]",local_2f0)
  ;
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"[5,1]((1)(2)(3[",local_2f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"[5,1]((1)(2)(3)[",local_2f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"[3,1]((1)(2),(3)[",local_2f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&local_310,_S_in);
  std::__cxx11::string::~string((string *)&local_310);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            (&myMatrixSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::~Signal(&myMatrixSignal);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(custom_matrix_registerer) {
  dynamicgraph::Signal<dynamicgraph::Matrix, int> myMatrixSignal("matrix");

  // Print the signal name.
  {
    output_test_stream output;
    output << myMatrixSignal;
    BOOST_CHECK(output.is_equal("Sig:matrix (Type Cst)"));
  }

  // Catch Exception of ss (not good input)

  // ss[0] != "["
  try {
    std::istringstream ss("test");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[0] != \"[\"";
  }

  // ss[1] != %i
  try {
    std::istringstream ss("[test");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[1] != %i";
  }

  // ss[2] != ","
  try {
    std::istringstream ss("[5[");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[2] != \",\"";
  }

  // ss[3] != %i
  try {
    std::istringstream ss("[5,c");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[3] != %i";
  }

  // ss[4] != "]"
  try {
    std::istringstream ss("[5,3[");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[4] != \"]\"";
  }

  // ss[5] != "("
  try {
    std::istringstream ss("[5,3]test");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[5] != \"(\"";
  }

  // ss[6] != "("
  try {
    std::istringstream ss("[5,3](test");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[6] != \"(\"";
  }

  // ss[8] != " " || ","
  try {
    std::istringstream ss("[5,3]((1,");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[8] != \" \" || \",\"";
  }

  // ss[6+n] != ")"
  try {
    std::istringstream ss("[5,3]((1,2,3]");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << ("ss[6+n] != \")\"");
  }

  // ss[-3] != ")"
  try {
    std::istringstream ss("[5,1]((1)(2)(3[");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[5] != \")\"";
  }

  // ss[-3] != ")"
  try {
    std::istringstream ss("[5,1]((1)(2)(3)[");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[5] != \")\"";
  }

  // ss[-1]!= ")"
  try {
    std::istringstream ss("[3,1]((1)(2),(3)[");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[5] != \")\" and ignore \",\"";
  }

  //[...]((...))
}